

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O3

ACT_TYPE __thiscall
despot::AdventurerSmartPolicy::Action
          (AdventurerSmartPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  int iVar1;
  pointer ppSVar2;
  long lVar3;
  byte bVar4;
  long lVar5;
  
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    iVar1 = this->regdemo_model_->size_;
    bVar4 = 1;
    lVar5 = 0;
    do {
      bVar4 = bVar4 & *(int *)(ppSVar2[lVar5] + 0xc) % iVar1 == iVar1 + -1;
      lVar5 = lVar5 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar5);
    return (uint)(bVar4 ^ 1) * 2;
  }
  return 0;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		bool at_goal = true;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			if (static_cast<AdventurerState*>(particle)->state_id
				% regdemo_model_->size_ != regdemo_model_->size_ - 1) {
				at_goal = false;
			}
		}

		if (at_goal) {
			return regdemo_model_->A_STAY;
		}
		return regdemo_model_->A_RIGHT;
	}